

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

void Acb_ObjPushToFanin(Acb_Ntk_t *p,int iObj,int iFaninIndex2,int iFanin)

{
  uint __line;
  int iVar1;
  int iVar2;
  int iFaninGiven;
  int iVar3;
  int iVar4;
  word wVar5;
  word wVar6;
  char *__assertion;
  word uTruthObjNew;
  
  uTruthObjNew = 0;
  wVar5 = Acb_ObjTruth(p,iObj);
  wVar6 = Acb_ObjTruth(p,iFanin);
  iVar1 = Acb_ObjWhatFanin(p,iObj,iFanin);
  iVar2 = Abc_TtCheckDsdAnd(wVar5,iVar1,iFaninIndex2,&uTruthObjNew);
  iFaninGiven = Acb_ObjFanin(p,iObj,iFaninIndex2);
  iVar3 = Acb_ObjWhatFanin(p,iFanin,iFaninGiven);
  if (iVar3 == -1) {
    iVar3 = Acb_ObjFaninNum(p,iFanin);
  }
  iVar4 = Acb_ObjIsCio(p,iObj);
  if (iVar4 == 0) {
    iVar4 = Acb_ObjIsCio(p,iFanin);
    if (iVar4 == 0) {
      iVar4 = Acb_ObjFaninNum(p,iObj);
      if (iVar1 < iVar4) {
        iVar4 = Acb_ObjFaninNum(p,iObj);
        if (iFaninIndex2 < iVar4) {
          if (iVar1 == iFaninIndex2) {
            __assertion = "iFaninIndex != iFaninIndex2";
            __line = 0x6d;
          }
          else {
            iVar1 = Acb_ObjFanoutNum(p,iFanin);
            if (iVar1 == 1) {
              switch(iVar2) {
              case 0:
                wVar6 = s_Truths6[iVar3] & wVar6;
                break;
              case 1:
                wVar6 = ~wVar6 & s_Truths6[iVar3];
                break;
              case 2:
                wVar6 = wVar6 & ~s_Truths6[iVar3];
                break;
              case 3:
                wVar6 = ~(s_Truths6[iVar3] | wVar6);
                break;
              case 4:
                wVar6 = s_Truths6[iVar3] ^ wVar6;
                break;
              default:
                __assertion = "0";
                __line = 0x7a;
                goto LAB_00314696;
              }
              wVar5 = Abc_Tt6RemoveVar(uTruthObjNew,iFaninIndex2);
              Vec_WrdWriteEntry(&p->vObjTruth,iObj,wVar5);
              Vec_WrdWriteEntry(&p->vObjTruth,iFanin,wVar6);
              Acb_ObjRemoveFaninFanoutOne(p,iObj,iFaninGiven);
              iVar1 = Acb_ObjFaninNum(p,iFanin);
              if (iVar3 == iVar1) {
                Acb_ObjAddFaninFanoutOne(p,iFanin,iFaninGiven);
              }
              return;
            }
            __assertion = "Acb_ObjFanoutNum(p, iFanin) == 1";
            __line = 0x6e;
          }
        }
        else {
          __assertion = "iFaninIndex2 < Acb_ObjFaninNum(p, iObj)";
          __line = 0x6c;
        }
      }
      else {
        __assertion = "iFaninIndex < Acb_ObjFaninNum(p, iObj)";
        __line = 0x6b;
      }
    }
    else {
      __assertion = "!Acb_ObjIsCio(p, iFanin)";
      __line = 0x6a;
    }
  }
  else {
    __assertion = "!Acb_ObjIsCio(p, iObj)";
    __line = 0x69;
  }
LAB_00314696:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                ,__line,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
}

Assistant:

void Acb_ObjPushToFanin( Acb_Ntk_t * p, int iObj, int iFaninIndex2, int iFanin )
{
    word uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj );
    word uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanin );
    int iFaninIndex = Acb_ObjWhatFanin( p, iObj, iFanin );
    int DecType = Abc_TtCheckDsdAnd( uTruthObj, iFaninIndex, iFaninIndex2, &uTruthObjNew );
    int iFanin2 = Acb_ObjFanin( p, iObj, iFaninIndex2 );
    int iFaninFaninIndex = Acb_ObjWhatFanin( p, iFanin, iFanin2 );
    if ( iFaninFaninIndex == -1 )
        iFaninFaninIndex = Acb_ObjFaninNum(p, iFanin); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanin) );
    assert( iFaninIndex  < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex2 < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex != iFaninIndex2 );
    assert( Acb_ObjFanoutNum(p, iFanin) == 1 );
    // compute new function of the fanout
    if ( DecType == 0 )      //  i *  j
        uTruthFanNew =  uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 1 ) //  i * !j
        uTruthFanNew = ~uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 2 ) // !i *  j
        uTruthFanNew =  uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 3 ) // !i * !j
        uTruthFanNew = ~uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 4 ) //  i #  j
        uTruthFanNew =  uTruthFan ^  s_Truths6[iFaninFaninIndex];
    else assert( 0 );
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex2) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanin, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin2 );
    if ( iFaninFaninIndex == Acb_ObjFaninNum(p, iFanin) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanin, iFanin2 );
}